

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall
capnp::AnyPointer::Reader::getPipelinedCap(Reader *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  ushort uVar1;
  Type TVar2;
  long in_RCX;
  long lVar3;
  PipelineOp *pPVar4;
  Own<capnp::ClientHook> OVar5;
  undefined1 local_88 [32];
  StructReader local_68;
  
  pPVar4 = ops.ptr;
  local_88._0_8_ = *pPVar4;
  local_88._8_8_ = pPVar4[1];
  local_88._16_8_ = pPVar4[2];
  local_88._24_8_ = pPVar4[3];
  for (lVar3 = 0; in_RCX << 3 != lVar3; lVar3 = lVar3 + 8) {
    if (*(int *)(ops.size_ + lVar3) == 1) {
      _::PointerReader::getStruct(&local_68,(PointerReader *)local_88,(word *)0x0);
      uVar1 = *(ushort *)(ops.size_ + 4 + lVar3);
      local_88._16_8_ = local_68.pointers + uVar1;
      local_88._0_4_ = (Type)local_68.segment;
      local_88._4_4_ = local_68.segment._4_4_;
      local_88._8_4_ = (Type)local_68.capTable;
      local_88._12_4_ = local_68.capTable._4_4_;
      TVar2 = local_68.nestingLimit;
      if (local_68.pointerCount <= uVar1) {
        local_88._16_4_ = NOOP;
        local_88._20_2_ = (anon_union_2_1_ac93b693_for_PipelineOp_2)0x0;
        local_88._22_2_ = 0;
        local_88._0_4_ = NOOP;
        local_88._4_4_ = 0;
        local_88._8_4_ = NOOP;
        local_88._12_4_ = 0;
        TVar2 = 0x7fffffff;
      }
      local_88._24_4_ = TVar2;
    }
  }
  OVar5 = _::PointerReader::getCapability(&this->reader);
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<ClientHook> AnyPointer::Reader::getPipelinedCap(
    kj::ArrayPtr<const PipelineOp> ops) const {
  _::PointerReader pointer = reader;

  for (auto& op: ops) {
    switch (op.type) {
      case PipelineOp::Type::NOOP:
        break;

      case PipelineOp::Type::GET_POINTER_FIELD:
        pointer = pointer.getStruct(nullptr).getPointerField(bounded(op.pointerIndex) * POINTERS);
        break;
    }
  }

  return pointer.getCapability();
}